

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O3

bool __thiscall Calculator::execute(Calculator *this,string *line,bool printResult)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  int base;
  pointer pcVar3;
  double dVar4;
  uint uVar5;
  ResultValue value;
  ResultValue value_00;
  size_type sVar6;
  Calculator *pCVar7;
  uint uVar8;
  bool bVar9;
  ResultValueType RVar10;
  long lVar11;
  int64_t iVar12;
  const_iterator cVar13;
  _Any_data *p_Var14;
  long *plVar15;
  ostream *poVar16;
  uint uVar17;
  size_type *psVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  size_type sVar22;
  _Alloc_hider _Var23;
  uint __len;
  ulong uVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  string __str;
  string baseSubscript;
  string cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Calculator *local_138;
  undefined1 local_130 [40];
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  string local_a8;
  string local_88;
  value_type local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_138 = this;
  if (line->_M_string_length < 2) {
    if (line->_M_string_length == 0) {
      return false;
    }
  }
  else if (*(line->_M_dataplus)._M_p == ':') {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)line);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158," ","");
    local_108._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = 0;
    local_130[0x10] = '\0';
    paVar1 = &local_178.field_2;
    while (lVar11 = std::__cxx11::string::find
                              ((char *)&local_68,(ulong)local_158._M_dataplus._M_p,0), lVar11 != -1)
    {
      std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_68);
      std::__cxx11::string::operator=((string *)local_130,(string *)&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar1) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108,(value_type *)local_130);
      std::__cxx11::string::erase((ulong)&local_68,0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108,&local_68);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_130._0_8_ = local_130 + 0x10;
    pcVar3 = ((_Alloc_hider *)local_108._0_8_)->_M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_130,pcVar3,pcVar3 + *(size_type *)(local_108._0_8_ + 8));
    this_00 = &local_138->mCommands;
    cVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&this_00->_M_h,(key_type *)local_130);
    if (cVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      poVar16 = local_138->mOutputStream;
      std::operator+(&local_158,"There exists no command called \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
      ;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_158);
      psVar18 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_178.field_2._M_allocated_capacity = *psVar18;
        local_178.field_2._8_8_ = plVar15[3];
        local_178._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_178.field_2._M_allocated_capacity = *psVar18;
        local_178._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_178._M_string_length = plVar15[1];
      *plVar15 = (long)psVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_178._M_dataplus._M_p,local_178._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar1) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      bVar9 = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_108,(iterator)local_108._0_8_);
      p_Var14 = (_Any_data *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108);
      if (*(long *)(p_Var14 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      bVar9 = (**(code **)(p_Var14->_M_pod_data + 0x18))(p_Var14,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    return bVar9;
  }
  CalculationEngine::evaluate((ResultValue *)local_130,&this->mEngine,line,&this->mEnvironment);
  RVar10 = ResultValue::type((ResultValue *)local_130);
  if (!printResult || RVar10 == NONE) {
    return false;
  }
  RVar10 = ResultValue::type((ResultValue *)local_130);
  if (RVar10 == INTEGER) {
    uVar21 = this->mPrintNumBase;
    if (uVar21 == 2) {
      poVar16 = this->mOutputStream;
      iVar12 = ResultValue::intValue((ResultValue *)local_130);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"0b","");
      NumberHelpers::toBase(&local_178,iVar12,2,&local_88);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_178._M_dataplus._M_p,local_178._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      _Var23._M_p = local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0011f3d9;
    }
    else {
      if (uVar21 == 10) {
        poVar16 = this->mOutputStream;
        ResultValue::intValue((ResultValue *)local_130);
        poVar16 = std::ostream::_M_insert<long>((long)poVar16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        goto LAB_0011eedf;
      }
      if (uVar21 == 0x10) {
        poVar16 = this->mOutputStream;
        iVar12 = ResultValue::intValue((ResultValue *)local_130);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"0x","");
        NumberHelpers::toBase(&local_178,iVar12,0x10,&local_a8);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,local_178._M_dataplus._M_p,local_178._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        local_88.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
        _Var23._M_p = local_a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_0011f3d9;
      }
      else {
        uVar5 = -uVar21;
        if (0 < (int)uVar21) {
          uVar5 = uVar21;
        }
        __len = 1;
        if (9 < uVar5) {
          uVar20 = (ulong)uVar5;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar17 = (uint)uVar20;
            if (uVar17 < 100) {
              __len = __len - 2;
              goto LAB_0011f0e9;
            }
            if (uVar17 < 1000) {
              __len = __len - 1;
              goto LAB_0011f0e9;
            }
            if (uVar17 < 10000) goto LAB_0011f0e9;
            uVar20 = uVar20 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar17);
          __len = __len + 1;
        }
LAB_0011f0e9:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_178,(char)__len - (char)((int)uVar21 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_178._M_dataplus._M_p + (uVar21 >> 0x1f),__len,uVar5);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x139295);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar18 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_158.field_2._M_allocated_capacity = *psVar18;
          local_158.field_2._8_8_ = plVar15[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar18;
          local_158._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_158._M_string_length = plVar15[1];
        *plVar15 = (long)psVar18;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        uVar24 = (ulong)this->mPrintNumBase;
        uVar20 = -uVar24;
        if (0 < (long)uVar24) {
          uVar20 = uVar24;
        }
        uVar21 = 1;
        if (9 < uVar20) {
          uVar19 = uVar20;
          uVar5 = 4;
          do {
            uVar21 = uVar5;
            if (uVar19 < 100) {
              uVar21 = uVar21 - 2;
              goto LAB_0011f203;
            }
            if (uVar19 < 1000) {
              uVar21 = uVar21 - 1;
              goto LAB_0011f203;
            }
            if (uVar19 < 10000) goto LAB_0011f203;
            bVar9 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            uVar5 = uVar21 + 4;
          } while (bVar9);
          uVar21 = uVar21 + 1;
        }
LAB_0011f203:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_178,(char)uVar21 - (char)(this->mPrintNumBase >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_178._M_dataplus._M_p + -((long)uVar24 >> 0x3f),uVar21,uVar20);
        sVar6 = local_178._M_string_length;
        _Var23._M_p = local_178._M_dataplus._M_p;
        pbVar2 = (pointer)(local_108 + 0x10);
        local_108._8_8_ = (pointer)0x0;
        local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
        local_108._0_8_ = pbVar2;
        if (local_178._M_string_length != 0) {
          sVar22 = 0;
          do {
            std::__cxx11::string::_M_append
                      (local_108,
                       *(ulong *)((anonymous_namespace)::subscripts_abi_cxx11_ + -0x600 +
                                 (long)_Var23._M_p[sVar22] * 0x20));
            sVar22 = sVar22 + 1;
          } while (sVar6 != sVar22);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::operator=((string *)&local_158,(string *)local_108);
        if ((pointer)local_108._0_8_ != pbVar2) {
          operator_delete((void *)local_108._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_108._16_8_)->_M_p + 1));
        }
        pCVar7 = local_138;
        poVar16 = local_138->mOutputStream;
        iVar12 = ResultValue::intValue((ResultValue *)local_130);
        base = pCVar7->mPrintNumBase;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
        NumberHelpers::toBase(&local_178,iVar12,base,&local_c8);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,local_178._M_dataplus._M_p,local_178._M_string_length);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,local_158._M_dataplus._M_p,local_158._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_88.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
        _Var23._M_p = local_158._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_0011f3d9;
      }
    }
    operator_delete(_Var23._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  else {
    RVar10 = ResultValue::type((ResultValue *)local_130);
    if ((RVar10 == COMPLEX) && (this->mPrintInPolar == true)) {
      ResultValue::complexValue((ResultValue *)local_130);
      dVar4 = cabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      poVar16 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," * e^(",6);
      ResultValue::complexValue((ResultValue *)local_130);
      dVar4 = carg((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      poVar16 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"i)",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      goto LAB_0011f3d9;
    }
    value.mFloatValue._1_7_ = local_130._17_7_;
    value.mFloatValue._0_1_ = local_130[0x10];
    value.mIntValue = local_130._8_8_;
    value._0_8_ = local_130._0_8_;
    value.mComplexValue._M_value._0_8_ = local_130._24_8_;
    value.mComplexValue._M_value._8_8_ = local_130._32_8_;
    poVar16 = operator<<(this->mOutputStream,value);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
LAB_0011eedf:
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
LAB_0011f3d9:
  local_e8._M_allocated_capacity = (size_type)&local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ans","");
  value_00.mFloatValue._1_7_ = local_130._17_7_;
  value_00.mFloatValue._0_1_ = local_130[0x10];
  value_00.mIntValue = local_130._8_8_;
  value_00._0_8_ = local_130._0_8_;
  value_00.mComplexValue._M_value._0_8_ = local_130._24_8_;
  value_00.mComplexValue._M_value._8_8_ = local_130._32_8_;
  Environment::set(&this->mEnvironment,(string *)&local_e8,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_allocated_capacity != &local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool Calculator::execute(const std::string& line, bool printResult) {
	if (line.size() > 1 && line[0] == ':') {
		auto parts = splitString(line.substr(1), " ");
		std::string cmd = parts[0];

		if (mCommands.count(cmd) > 0) {
			parts.erase(parts.begin());
			return mCommands[cmd](parts);
		} else {
			mOutputStream << "There exists no command called '" + cmd + "'. Type ':help' for a list of commands." << std::endl;
		}

		return false;
	}

	if (line.empty()) {
		return false;
	}

	try {
		auto res = mEngine.evaluate(line, mEnvironment);

		if (res.type() != ResultValueType::NONE) {
			if (printResult) {
				if (res.type() == ResultValueType::INTEGER) {
					switch (mPrintNumBase) {
						case 2:
							mOutputStream << NumberHelpers::toBase(res.intValue(), 2, "0b") << std::endl;
							break;
						case 10:
							mOutputStream << res.intValue() << std::endl;
							break;
						case 16:
							mOutputStream << NumberHelpers::toBase(res.intValue(), 16, "0x") << std::endl;
							break;
						default:
							std::string baseSubscript = "_" + std::to_string(mPrintNumBase);

							#ifdef __unix__
							baseSubscript = getSubscript(mPrintNumBase);
							#endif

							mOutputStream << NumberHelpers::toBase(res.intValue(), mPrintNumBase) << baseSubscript << std::endl;
							break;
					}
				} else if (res.type() == ResultValueType::COMPLEX && mPrintInPolar) {
					mOutputStream << std::abs(res.complexValue()) << " * e^(" << std::arg(res.complexValue()) << "i)" << std::endl;
				} else {
					mOutputStream << res << std::endl;
				}

				mEnvironment.set("ans", res);
			}
		}
	} catch (std::exception& e) {
		mOutputStream << "Error: " << e.what() << std::endl;
	}

	return false;
}